

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_chacha20_poly1305.c
# Opt level: O0

int chacha20_poly1305_init_key(EVP_CIPHER_CTX *ctx,uchar *inkey,uchar *iv,int enc)

{
  int in_ECX;
  void *in_RDX;
  uchar *in_RSI;
  EVP_CIPHER_CTX *in_RDI;
  uchar temp [16];
  EVP_CHACHA_AEAD_CTX *actx;
  uchar auStack_48 [16];
  undefined1 auStack_38 [8];
  void *local_30;
  int local_24;
  void *local_20;
  uchar *local_18;
  EVP_CIPHER_CTX *local_10;
  
  local_30 = in_RDI->cipher_data;
  if ((in_RSI != (uchar *)0x0) || (in_RDX != (void *)0x0)) {
    *(undefined8 *)((long)local_30 + 0xa8) = 0;
    *(undefined8 *)((long)local_30 + 0xb0) = 0;
    *(undefined4 *)((long)local_30 + 0xb8) = 0;
    *(undefined4 *)((long)local_30 + 0xbc) = 0;
    *(undefined8 *)((long)local_30 + 200) = 0xffffffffffffffff;
    if (in_RDX == (void *)0x0) {
      chacha_init_key(in_RDI,in_RSI,(uchar *)0x0,in_ECX);
    }
    else {
      local_24 = in_ECX;
      local_20 = in_RDX;
      local_18 = in_RSI;
      local_10 = in_RDI;
      memset(auStack_48,0,0x10);
      if (*(int *)((long)local_30 + 0xc4) < 0x11) {
        memcpy(auStack_38 + -(long)*(int *)((long)local_30 + 0xc4),local_20,
               (long)*(int *)((long)local_30 + 0xc4));
      }
      chacha_init_key(local_10,local_18,auStack_48,local_24);
      *(undefined4 *)((long)local_30 + 0x78) = *(undefined4 *)((long)local_30 + 0x24);
      *(undefined4 *)((long)local_30 + 0x7c) = *(undefined4 *)((long)local_30 + 0x28);
      *(undefined4 *)((long)local_30 + 0x80) = *(undefined4 *)((long)local_30 + 0x2c);
    }
  }
  return 1;
}

Assistant:

static int chacha20_poly1305_init_key(EVP_CIPHER_CTX *ctx,
                                      const unsigned char *inkey,
                                      const unsigned char *iv, int enc)
{
    EVP_CHACHA_AEAD_CTX *actx = aead_data(ctx);

    if (!inkey && !iv)
        return 1;

    actx->len.aad = 0;
    actx->len.text = 0;
    actx->aad = 0;
    actx->mac_inited = 0;
    actx->tls_payload_length = NO_TLS_PAYLOAD_LENGTH;

    if (iv != NULL) {
        unsigned char temp[CHACHA_CTR_SIZE] = { 0 };

        /* pad on the left */
        if (actx->nonce_len <= CHACHA_CTR_SIZE)
            memcpy(temp + CHACHA_CTR_SIZE - actx->nonce_len, iv,
                   actx->nonce_len);

        chacha_init_key(ctx, inkey, temp, enc);

        actx->nonce[0] = actx->key.counter[1];
        actx->nonce[1] = actx->key.counter[2];
        actx->nonce[2] = actx->key.counter[3];
    } else {
        chacha_init_key(ctx, inkey, NULL, enc);
    }

    return 1;
}